

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageLoadStoreTests.cpp
# Opt level: O3

bool __thiscall
gl4cts::(anonymous_namespace)::BasicAllFormatsLoadGeometryStages::Read<tcu::Vector<int,4>>
          (BasicAllFormatsLoadGeometryStages *this,GLenum internalformat,Vector<int,_4> *value,
          Vector<int,_4> *expected_value)

{
  CallLogWrapper *this_00;
  void *this_01;
  _Alloc_hider _Var1;
  long *src_tes;
  GLuint program;
  GLint GVar2;
  ostream *poVar3;
  char *pcVar4;
  GLenum e;
  GLenum e_00;
  GLenum e_01;
  GLenum e_02;
  GLenum e_03;
  int i_1;
  ulong uVar5;
  int i;
  long lVar6;
  bool bVar7;
  vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> data;
  string local_2b8;
  vec4 result;
  undefined2 local_288;
  undefined6 uStack_286;
  BasicAllFormatsLoadGeometryStages *local_270;
  vec4 zero;
  undefined2 local_258;
  undefined6 uStack_256;
  long *local_240;
  long *local_238;
  Vector<int,_4> *local_230;
  long *local_228;
  long local_218 [2];
  long *local_208;
  long local_1f8 [2];
  long *local_1e8;
  long local_1d8 [2];
  long *local_1c8;
  long local_1b8 [2];
  GLuint texture [8];
  ios_base local_138 [264];
  
  this_01 = (void *)(ulong)internalformat;
  local_270 = this;
  local_230 = value;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)texture);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)texture,"#version 420 core\nlayout(",0x19);
  ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_(&local_2b8,this_01,e);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)texture,local_2b8._M_dataplus._M_p,local_2b8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,") readonly uniform ",0x13);
  data.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)&data.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
  data.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_2_ = 0x69;
  data.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)&DAT_00000001;
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,(char *)data.
                                     super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start,1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,
             "image2DArray g_image0;\nlayout(rgba32f) writeonly uniform image2D g_image0_result;\nvoid main() {\n  ivec3 coord = ivec3(gl_VertexID, 0, 0);\n  "
             ,0x8c);
  local_258 = 0x69;
  zero.m_data[2] = 1.4013e-45;
  zero.m_data[3] = 0.0;
  zero.m_data._0_8_ = &local_258;
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)&local_258,1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,"vec4 v = imageLoad(g_image0, coord);\n  if (v != ",0x30);
  local_288 = 0x69;
  result.m_data[2] = 1.4013e-45;
  result.m_data[3] = 0.0;
  result.m_data._0_8_ = &local_288;
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)&local_288,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"vec4",4);
  poVar3 = tcu::operator<<(poVar3,expected_value);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,
             ") imageStore(g_image0_result, coord.xy, vec4(1.0, 0.0, 0.0, 1.0));\n  else imageStore(g_image0_result, coord.xy, vec4(0.0, 1.0, 0.0, 1.0));\n}"
             ,0x8c);
  if ((undefined2 *)result.m_data._0_8_ != &local_288) {
    operator_delete((void *)result.m_data._0_8_,CONCAT62(uStack_286,local_288) + 1);
  }
  if ((undefined2 *)zero.m_data._0_8_ != &local_258) {
    operator_delete((void *)zero.m_data._0_8_,CONCAT62(uStack_256,local_258) + 1);
  }
  if (data.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (pointer)&data.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
    operator_delete(data.
                    super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    CONCAT62(data.
                             super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage._2_6_,
                             data.
                             super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage._0_2_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
    operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)texture);
  std::ios_base::~ios_base(local_138);
  local_238 = local_1c8;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)texture);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)texture,"#version 420 core\nlayout(vertices = 1) out;\nlayout(",0x33);
  ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_(&local_2b8,this_01,e_00);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)texture,local_2b8._M_dataplus._M_p,local_2b8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,") readonly uniform ",0x13);
  data.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)&data.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
  data.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_2_ = 0x69;
  data.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)&DAT_00000001;
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,(char *)data.
                                     super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start,1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,
             "image2DArray g_image1;\nlayout(rgba32f) writeonly uniform image2D g_image1_result;\nvoid main() {\n  gl_TessLevelInner[0] = 1;\n  gl_TessLevelInner[1] = 1;\n  gl_TessLevelOuter[0] = 1;\n  gl_TessLevelOuter[1] = 1;\n  gl_TessLevelOuter[2] = 1;\n  gl_TessLevelOuter[3] = 1;\n  ivec3 coord = ivec3(gl_PrimitiveID, 0, 0);\n  "
             ,0x137);
  local_258 = 0x69;
  zero.m_data[2] = 1.4013e-45;
  zero.m_data[3] = 0.0;
  zero.m_data._0_8_ = &local_258;
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)&local_258,1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,"vec4 v = imageLoad(g_image1, coord);\n  if (v != ",0x30);
  local_288 = 0x69;
  result.m_data[2] = 1.4013e-45;
  result.m_data[3] = 0.0;
  result.m_data._0_8_ = &local_288;
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)&local_288,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"vec4",4);
  poVar3 = tcu::operator<<(poVar3,expected_value);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,
             ") imageStore(g_image1_result, coord.xy, vec4(1.0, 0.0, 0.0, 1.0));\n  else imageStore(g_image1_result, coord.xy, vec4(0.0, 1.0, 0.0, 1.0));\n}"
             ,0x8c);
  if ((undefined2 *)result.m_data._0_8_ != &local_288) {
    operator_delete((void *)result.m_data._0_8_,CONCAT62(uStack_286,local_288) + 1);
  }
  if ((undefined2 *)zero.m_data._0_8_ != &local_258) {
    operator_delete((void *)zero.m_data._0_8_,CONCAT62(uStack_256,local_258) + 1);
  }
  if (data.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (pointer)&data.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
    operator_delete(data.
                    super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    CONCAT62(data.
                             super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage._2_6_,
                             data.
                             super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage._0_2_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
    operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)texture);
  std::ios_base::~ios_base(local_138);
  local_240 = local_1e8;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)texture);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)texture,"#version 420 core\nlayout(triangles, point_mode) in;\nlayout(",0x3b
            );
  ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_(&local_2b8,this_01,e_01);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)texture,local_2b8._M_dataplus._M_p,local_2b8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,") readonly uniform ",0x13);
  data.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)&data.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
  data.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_2_ = 0x69;
  data.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)&DAT_00000001;
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,(char *)data.
                                     super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start,1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,
             "image2DArray g_image2;\nlayout(rgba32f) writeonly uniform image2D g_image2_result;\nvoid main() {\n  ivec3 coord = ivec3(gl_PrimitiveID, 0, 0);\n  "
             ,0x8f);
  local_258 = 0x69;
  zero.m_data[2] = 1.4013e-45;
  zero.m_data[3] = 0.0;
  zero.m_data._0_8_ = &local_258;
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)&local_258,1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,"vec4 v = imageLoad(g_image2, coord);\n  if (v != ",0x30);
  local_288 = 0x69;
  result.m_data[2] = 1.4013e-45;
  result.m_data[3] = 0.0;
  result.m_data._0_8_ = &local_288;
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)&local_288,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"vec4",4);
  poVar3 = tcu::operator<<(poVar3,expected_value);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,
             ") imageStore(g_image2_result, coord.xy, vec4(1.0, 0.0, 0.0, 1.0));\n  else imageStore(g_image2_result, coord.xy, vec4(0.0, 1.0, 0.0, 1.0));\n}"
             ,0x8c);
  if ((undefined2 *)result.m_data._0_8_ != &local_288) {
    operator_delete((void *)result.m_data._0_8_,CONCAT62(uStack_286,local_288) + 1);
  }
  if ((undefined2 *)zero.m_data._0_8_ != &local_258) {
    operator_delete((void *)zero.m_data._0_8_,CONCAT62(uStack_256,local_258) + 1);
  }
  if (data.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (pointer)&data.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
    operator_delete(data.
                    super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    CONCAT62(data.
                             super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage._2_6_,
                             data.
                             super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage._0_2_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
    operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)texture);
  std::ios_base::~ios_base(local_138);
  src_tes = local_208;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)texture);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)texture,
             "#version 420 core\nlayout(points) in;\nlayout(points, max_vertices = 1) out;\nlayout("
             ,0x52);
  ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_(&local_2b8,this_01,e_02);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)texture,local_2b8._M_dataplus._M_p,local_2b8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,") readonly uniform ",0x13);
  data.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)&data.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
  data.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_2_ = 0x69;
  data.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)&DAT_00000001;
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,(char *)data.
                                     super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start,1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,
             "image2DArray g_image3;\nlayout(rgba32f) writeonly uniform image2D g_image3_result;\nvoid main() {\n  ivec3 coord = ivec3(gl_PrimitiveIDIn, 0, 0);\n  "
             ,0x91);
  local_258 = 0x69;
  zero.m_data[2] = 1.4013e-45;
  zero.m_data[3] = 0.0;
  zero.m_data._0_8_ = &local_258;
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)&local_258,1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,"vec4 v = imageLoad(g_image3, coord);\n  if (v != ",0x30);
  local_288 = 0x69;
  result.m_data[2] = 1.4013e-45;
  result.m_data[3] = 0.0;
  result.m_data._0_8_ = &local_288;
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)&local_288,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"vec4",4);
  poVar3 = tcu::operator<<(poVar3,expected_value);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,
             ") imageStore(g_image3_result, coord.xy, vec4(1.0, 0.0, 0.0, 1.0));\n  else imageStore(g_image3_result, coord.xy, vec4(0.0, 1.0, 0.0, 1.0));\n}"
             ,0x8c);
  if ((undefined2 *)result.m_data._0_8_ != &local_288) {
    operator_delete((void *)result.m_data._0_8_,CONCAT62(uStack_286,local_288) + 1);
  }
  if ((undefined2 *)zero.m_data._0_8_ != &local_258) {
    operator_delete((void *)zero.m_data._0_8_,CONCAT62(uStack_256,local_258) + 1);
  }
  if (data.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (pointer)&data.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
    operator_delete(data.
                    super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    CONCAT62(data.
                             super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage._2_6_,
                             data.
                             super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage._0_2_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
    operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)texture);
  std::ios_base::~ios_base(local_138);
  program = gl4cts::anon_unknown_0::ShaderImageLoadStoreBase::BuildProgram
                      ((ShaderImageLoadStoreBase *)local_270,(char *)local_238,(char *)local_240,
                       (char *)src_tes,(char *)local_228,(char *)0x0,(bool *)0x0);
  if (local_228 != local_218) {
    operator_delete(local_228,local_218[0] + 1);
  }
  if (local_208 != local_1f8) {
    operator_delete(local_208,local_1f8[0] + 1);
  }
  if (local_1e8 != local_1d8) {
    operator_delete(local_1e8,local_1d8[0] + 1);
  }
  if (local_1c8 != local_1b8) {
    operator_delete(local_1c8,local_1b8[0] + 1);
  }
  std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::vector
            (&data,1,local_230,(allocator_type *)texture);
  this_00 = (CallLogWrapper *)(local_270 + 8);
  glu::CallLogWrapper::glGenTextures(this_00,8,texture);
  lVar6 = 0;
  do {
    glu::CallLogWrapper::glBindTexture(this_00,0x8c1a,texture[lVar6]);
    glu::CallLogWrapper::glTexParameteri(this_00,0x8c1a,0x2801,0x2600);
    glu::CallLogWrapper::glTexParameteri(this_00,0x8c1a,0x2800,0x2600);
    glu::CallLogWrapper::glTexImage3D
              (this_00,0x8c1a,0,internalformat,1,1,1,0,0x8d99,0x1404,
               data.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start);
    lVar6 = lVar6 + 1;
  } while (lVar6 != 4);
  glu::CallLogWrapper::glBindTexture(this_00,0x8c1a,0);
  zero.m_data[0] = 0.0;
  zero.m_data[1] = 0.0;
  zero.m_data[2] = 0.0;
  zero.m_data[3] = 0.0;
  lVar6 = 4;
  do {
    glu::CallLogWrapper::glBindTexture(this_00,0xde1,texture[lVar6]);
    glu::CallLogWrapper::glTexParameteri(this_00,0xde1,0x2801,0x2600);
    glu::CallLogWrapper::glTexParameteri(this_00,0xde1,0x2800,0x2600);
    glu::CallLogWrapper::glTexImage2D(this_00,0xde1,0,0x8814,1,1,0,0x1908,0x1406,&zero);
    lVar6 = lVar6 + 1;
  } while (lVar6 != 8);
  glu::CallLogWrapper::glBindTexture(this_00,0xde1,0);
  glu::CallLogWrapper::glUseProgram(this_00,program);
  GVar2 = glu::CallLogWrapper::glGetUniformLocation(this_00,program,"g_image0");
  glu::CallLogWrapper::glUniform1i(this_00,GVar2,0);
  GVar2 = glu::CallLogWrapper::glGetUniformLocation(this_00,program,"g_image1");
  glu::CallLogWrapper::glUniform1i(this_00,GVar2,1);
  GVar2 = glu::CallLogWrapper::glGetUniformLocation(this_00,program,"g_image2");
  glu::CallLogWrapper::glUniform1i(this_00,GVar2,2);
  GVar2 = glu::CallLogWrapper::glGetUniformLocation(this_00,program,"g_image3");
  glu::CallLogWrapper::glUniform1i(this_00,GVar2,3);
  GVar2 = glu::CallLogWrapper::glGetUniformLocation(this_00,program,"g_image0_result");
  glu::CallLogWrapper::glUniform1i(this_00,GVar2,4);
  GVar2 = glu::CallLogWrapper::glGetUniformLocation(this_00,program,"g_image1_result");
  glu::CallLogWrapper::glUniform1i(this_00,GVar2,5);
  GVar2 = glu::CallLogWrapper::glGetUniformLocation(this_00,program,"g_image2_result");
  glu::CallLogWrapper::glUniform1i(this_00,GVar2,6);
  GVar2 = glu::CallLogWrapper::glGetUniformLocation(this_00,program,"g_image3_result");
  glu::CallLogWrapper::glUniform1i(this_00,GVar2,7);
  lVar6 = 0;
  do {
    glu::CallLogWrapper::glBindImageTexture
              (this_00,(GLuint)lVar6,texture[lVar6],0,'\x01',0,35000,internalformat);
    lVar6 = lVar6 + 1;
  } while (lVar6 != 4);
  lVar6 = 4;
  do {
    glu::CallLogWrapper::glBindImageTexture
              (this_00,(GLuint)lVar6,texture[lVar6],0,'\0',0,0x88b9,0x8814);
    lVar6 = lVar6 + 1;
  } while (lVar6 != 8);
  glu::CallLogWrapper::glBindVertexArray(this_00,*(GLuint *)(local_270 + 0x28));
  glu::CallLogWrapper::glPatchParameteri(this_00,0x8e72,1);
  glu::CallLogWrapper::glDrawArrays(this_00,0xe,0,1);
  glu::CallLogWrapper::glPatchParameteri(this_00,0x8e72,3);
  lVar6 = (**(code **)(**(long **)(*(long *)(local_270 + 0x20) + 8) + 0x20))();
  local_270 = (BasicAllFormatsLoadGeometryStages *)
              CONCAT44(local_270._4_4_,1.0 / (float)(1 << (*(byte *)(lVar6 + 8) & 0x1f)));
  local_230 = (Vector<int,_4> *)
              CONCAT44(local_230._4_4_,1.0 / (float)(1 << (*(byte *)(lVar6 + 0xc) & 0x1f)));
  local_238 = (long *)CONCAT44(local_238._4_4_,1.0 / (float)(1 << (*(byte *)(lVar6 + 0x10) & 0x1f)))
  ;
  local_240 = (long *)CONCAT44(local_240._4_4_,1.0 / (float)(1 << (*(byte *)(lVar6 + 0x14) & 0x1f)))
  ;
  uVar5 = 0;
  bVar7 = false;
  while( true ) {
    glu::CallLogWrapper::glBindTexture(this_00,0xde1,texture[uVar5 + 4]);
    glu::CallLogWrapper::glMemoryBarrier(this_00,0x100);
    result.m_data[0] = 0.0;
    result.m_data[1] = 0.0;
    result.m_data[2] = 0.0;
    result.m_data[3] = 0.0;
    glu::CallLogWrapper::glGetTexImage(this_00,0xde1,0,0x1908,0x1406,&result);
    if ((((local_270._0_4_ < ABS(result.m_data[0])) ||
         (local_230._0_4_ < ABS(result.m_data[1] + -1.0))) ||
        (local_238._0_4_ < ABS(result.m_data[2]))) ||
       (local_240._0_4_ < ABS(result.m_data[3] + -1.0))) break;
    bVar7 = 2 < uVar5;
    uVar5 = uVar5 + 1;
    if (uVar5 == 4) {
      glu::CallLogWrapper::glDeleteTextures(this_00,8,texture);
      glu::CallLogWrapper::glUseProgram(this_00,0);
      bVar7 = true;
      glu::CallLogWrapper::glDeleteProgram(this_00,program);
LAB_00993f97:
      if (data.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(data.
                        super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        CONCAT62(data.
                                 super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage._2_6_,
                                 data.
                                 super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage._0_2_) -
                        (long)data.
                              super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      return bVar7;
    }
  }
  glu::CallLogWrapper::glDeleteTextures(this_00,8,texture);
  glu::CallLogWrapper::glUseProgram(this_00,0);
  glu::CallLogWrapper::glDeleteProgram(this_00,program);
  ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_(&local_2b8,this_01,e_03);
  _Var1._M_p = local_2b8._M_dataplus._M_p;
  pcVar4 = gl4cts::anon_unknown_0::ShaderImageLoadStoreBase::StageName
                     ((ShaderImageLoadStoreBase *)(uVar5 & 0xffffffff),internalformat);
  gl4cts::anon_unknown_0::Output("Bad load value. Format is: %s. Stage is: %s.\n",_Var1._M_p,pcVar4)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
    operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
  }
  goto LAB_00993f97;
}

Assistant:

bool Read(GLenum internalformat, const T& value, const T& expected_value)
	{
		const GLuint program = BuildProgram(
			GenVS(internalformat, expected_value).c_str(), GenTCS(internalformat, expected_value).c_str(),
			GenTES(internalformat, expected_value).c_str(), GenGS(internalformat, expected_value).c_str(), NULL);
		const int	  kSize = 1;
		std::vector<T> data(kSize * kSize, value);
		GLuint		   texture[8];
		glGenTextures(8, texture);

		for (int i = 0; i < 4; ++i)
		{
			glBindTexture(GL_TEXTURE_2D_ARRAY, texture[i]);
			glTexParameteri(GL_TEXTURE_2D_ARRAY, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
			glTexParameteri(GL_TEXTURE_2D_ARRAY, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
			glTexImage3D(GL_TEXTURE_2D_ARRAY, 0, internalformat, kSize, kSize, 1, 0, Format<T>(), Type<T>(), &data[0]);
		}
		glBindTexture(GL_TEXTURE_2D_ARRAY, 0);
		vec4 zero(0);
		for (int i = 4; i < 8; ++i)
		{
			glBindTexture(GL_TEXTURE_2D, texture[i]);
			glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
			glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
			glTexImage2D(GL_TEXTURE_2D, 0, GL_RGBA32F, kSize, kSize, 0, GL_RGBA, GL_FLOAT, &zero);
		}
		glBindTexture(GL_TEXTURE_2D, 0);

		glUseProgram(program);
		glUniform1i(glGetUniformLocation(program, "g_image0"), 0);
		glUniform1i(glGetUniformLocation(program, "g_image1"), 1);
		glUniform1i(glGetUniformLocation(program, "g_image2"), 2);
		glUniform1i(glGetUniformLocation(program, "g_image3"), 3);
		glUniform1i(glGetUniformLocation(program, "g_image0_result"), 4);
		glUniform1i(glGetUniformLocation(program, "g_image1_result"), 5);
		glUniform1i(glGetUniformLocation(program, "g_image2_result"), 6);
		glUniform1i(glGetUniformLocation(program, "g_image3_result"), 7);

		for (GLuint i = 0; i < 4; ++i)
		{
			glBindImageTexture(i, texture[i], 0, GL_TRUE, 0, GL_READ_ONLY, internalformat);
		}
		for (GLuint i = 4; i < 8; ++i)
		{
			glBindImageTexture(i, texture[i], 0, GL_FALSE, 0, GL_WRITE_ONLY, GL_RGBA32F);
		}
		glBindVertexArray(m_vao);
		glPatchParameteri(GL_PATCH_VERTICES, 1);
		glDrawArrays(GL_PATCHES, 0, 1);
		glPatchParameteri(GL_PATCH_VERTICES, 3);

		const tcu::RenderTarget& renderTarget = m_context.getRenderContext().getRenderTarget();
		const tcu::PixelFormat&  pixelFormat  = renderTarget.getPixelFormat();
		vec4					 g_color_eps  = vec4(
			1.f / static_cast<float>(1 << pixelFormat.redBits), 1.f / static_cast<float>(1 << pixelFormat.greenBits),
			1.f / static_cast<float>(1 << pixelFormat.blueBits), 1.f / static_cast<float>(1 << pixelFormat.alphaBits));

		for (int i = 0; i < 4; ++i)
		{
			glBindTexture(GL_TEXTURE_2D, texture[i + 4]);
			glMemoryBarrier(GL_TEXTURE_UPDATE_BARRIER_BIT);
			vec4 result;
			glGetTexImage(GL_TEXTURE_2D, 0, GL_RGBA, GL_FLOAT, &result[0]);
			if (!ColorEqual(result, vec4(0, 1, 0, 1), g_color_eps))
			{
				glDeleteTextures(8, texture);
				glUseProgram(0);
				glDeleteProgram(program);
				Output("Bad load value. Format is: %s. Stage is: %s.\n", FormatEnumToString(internalformat).c_str(),
					   StageName(i));
				return false;
			}
		}
		glDeleteTextures(8, texture);
		glUseProgram(0);
		glDeleteProgram(program);
		return true;
	}